

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

ImPlotLimits * ImPlot::GetPlotLimits(ImPlotLimits *__return_storage_ptr__,ImPlotYAxis y_axis_in)

{
  ImPlotPlot *pIVar1;
  bool bVar2;
  int local_48;
  ImPlotPlot *plot;
  ImPlotYAxis y_axis;
  ImPlotContext *gp;
  ImPlotYAxis y_axis_in_local;
  
  bVar2 = false;
  if ((-2 < y_axis_in) && (bVar2 = false, y_axis_in < 3)) {
    bVar2 = true;
  }
  if (!bVar2) {
    __assert_fail("(y_axis_in >= -1 && y_axis_in < 3) && \"y_axis needs to between -1 and IMPLOT_Y_AXES\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xa95,"ImPlotLimits ImPlot::GetPlotLimits(ImPlotYAxis)");
  }
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    local_48 = y_axis_in;
    if (y_axis_in < 0) {
      local_48 = GImPlot->CurrentPlot->CurrentYAxis;
    }
    pIVar1 = GImPlot->CurrentPlot;
    ImPlotLimits::ImPlotLimits(__return_storage_ptr__);
    (__return_storage_ptr__->X).Min = (pIVar1->XAxis).Range.Min;
    (__return_storage_ptr__->X).Max = (pIVar1->XAxis).Range.Max;
    (__return_storage_ptr__->Y).Min = pIVar1->YAxis[local_48].Range.Min;
    (__return_storage_ptr__->Y).Max = pIVar1->YAxis[local_48].Range.Max;
    return __return_storage_ptr__;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"GetPlotLimits() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xa96,"ImPlotLimits ImPlot::GetPlotLimits(ImPlotYAxis)");
}

Assistant:

ImPlotLimits GetPlotLimits(ImPlotYAxis y_axis_in) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(y_axis_in >= -1 && y_axis_in < IMPLOT_Y_AXES, "y_axis needs to between -1 and IMPLOT_Y_AXES");
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "GetPlotLimits() needs to be called between BeginPlot() and EndPlot()!");
    const ImPlotYAxis y_axis = y_axis_in >= 0 ? y_axis_in : gp.CurrentPlot->CurrentYAxis;

    ImPlotPlot& plot = *gp.CurrentPlot;
    ImPlotLimits limits;
    limits.X = plot.XAxis.Range;
    limits.Y = plot.YAxis[y_axis].Range;
    return limits;
}